

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::ResidualCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *residual,int icase)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  TPZTensor<double> obj;
  TPZDecomposed objdec;
  
  TPZTensor<double>::TPZTensor(&obj);
  pdVar2 = state->fElem;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    obj.fData.super_TPZVec<double>.fStore[lVar4] = pdVar2[lVar4];
  }
  obj.fData.super_TPZVec<double>.fStore[1] =
       obj.fData.super_TPZVec<double>.fStore[1] * 0.5 + pdVar2[6] * 0.5;
  obj.fData.super_TPZVec<double>.fStore[2] =
       (obj.fData.super_TPZVec<double>.fStore[2] + pdVar2[7]) * 0.5;
  obj.fData.super_TPZVec<double>.fStore[4] =
       (obj.fData.super_TPZVec<double>.fStore[4] + pdVar2[8]) * 0.5;
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(&objdec,&obj);
  (*(residual->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (residual);
  if ((uint)icase < 3) {
    uVar6 = (ulong)(uint)icase;
    dVar1 = objdec.fEigenvalues.super_TPZVec<double>.fStore[uVar6];
    pdVar2 = TPZFMatrix<double>::operator()(residual,0,0);
    *pdVar2 = dVar1;
    pdVar2 = residual->fElem;
    iVar3 = 1;
    for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
      if (((uVar6 != uVar5) && (gEigval[uVar5] == gEigval[uVar6])) &&
         (!NAN(gEigval[uVar5]) && !NAN(gEigval[uVar6]))) {
        iVar3 = iVar3 + 1;
        *pdVar2 = objdec.fEigenvalues.super_TPZVec<double>.fStore[uVar5] + *pdVar2;
      }
    }
    *pdVar2 = *pdVar2 / (double)iVar3;
  }
  TPZTensor<double>::TPZDecomposed::~TPZDecomposed(&objdec);
  TPZTensor<double>::~TPZTensor(&obj);
  return;
}

Assistant:

static void ResidualCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &residual, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            obj[_XY_] = obj[_XY_]*0.5 + 0.5 * state(6);
            obj[_XZ_] = (obj[_XZ_] + state(7))*0.5;
            obj[_YZ_] = (obj[_YZ_] + state(8))*0.5;
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            residual.Resize(1, 1);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    residual(0, 0) = objdec.fEigenvalues[icase];
                    int numequal = 1;
                    for (int i = 0; i < 3; i++) {
                        if (i == icase) {
                            continue;
                        }
                        if (gEigval[i] == gEigval[icase]) {
                            numequal++;
                            residual(0) += objdec.fEigenvalues[i];
                        }
                    }
                    residual(0) /= numequal;
                }
                    break;

                default:
                    break;
            }
        }